

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_matmul.c
# Opt level: O0

rt_function_error_t allocate_batch_matmul_local_context(rt_function_t *f)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  rt_variable_getter p_Var4;
  rt_variable_setter p_Var5;
  rt_list_t shape;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int j;
  int samples_b;
  int i;
  batch_matmul_private_t *p;
  batch_matmul_local_context_t *context;
  rt_function_t *f_local;
  
  if (f->num_of_inputs == 2) {
    if (f->num_of_outputs == 1) {
      pvVar1 = f->local_context;
      piVar3 = (int *)(*rt_malloc_func)(0x68);
      if (piVar3 == (int *)0x0) {
        f_local._4_4_ = RT_FUNCTION_ERROR_MALLOC;
      }
      else {
        *(int **)f->local_context = piVar3;
        piVar3[2] = ((*f->inputs)->shape).data[((*f->inputs)->shape).size + -2];
        piVar3[1] = ((*f->inputs)->shape).data[((*f->inputs)->shape).size + -1];
        piVar3[4] = (f->inputs[1]->shape).data[(f->inputs[1]->shape).size + -2];
        piVar3[3] = (f->inputs[1]->shape).data[(f->inputs[1]->shape).size + -1];
        if (*(char *)((long)pvVar1 + 8) == '\0') {
          local_38 = piVar3[2];
        }
        else {
          local_38 = piVar3[1];
        }
        piVar3[6] = local_38;
        if (*(char *)((long)pvVar1 + 9) == '\0') {
          local_3c = piVar3[3];
        }
        else {
          local_3c = piVar3[4];
        }
        piVar3[5] = local_3c;
        piVar3[7] = piVar3[2] * piVar3[1];
        piVar3[8] = piVar3[4] * piVar3[3];
        piVar3[9] = piVar3[6] * piVar3[5];
        *(rt_variable_t **)(piVar3 + 10) = *f->inputs;
        p_Var4 = select_getter(*(rt_variable_t **)(piVar3 + 10));
        *(rt_variable_getter *)(piVar3 + 0xc) = p_Var4;
        *(rt_variable_t **)(piVar3 + 0xe) = f->inputs[1];
        p_Var4 = select_getter(*(rt_variable_t **)(piVar3 + 0xe));
        *(rt_variable_getter *)(piVar3 + 0x10) = p_Var4;
        *piVar3 = 1;
        for (j = 0; j < ((*f->inputs)->shape).size + -2; j = j + 1) {
          *piVar3 = ((*f->inputs)->shape).data[j] * *piVar3;
        }
        local_30 = 1;
        for (local_34 = 0; local_34 < (f->inputs[1]->shape).size + -2; local_34 = local_34 + 1) {
          local_30 = (f->inputs[1]->shape).data[local_34] * local_30;
        }
        *(rt_variable_t **)(piVar3 + 0x12) = *f->outputs;
        p_Var4 = select_getter(*(rt_variable_t **)(piVar3 + 0x12));
        *(rt_variable_getter *)(piVar3 + 0x14) = p_Var4;
        p_Var5 = select_setter(*(rt_variable_t **)(piVar3 + 0x12));
        *(rt_variable_setter *)(piVar3 + 0x16) = p_Var5;
        shape._4_4_ = 0;
        shape.size = ((*f->outputs)->shape).size;
        shape.data = ((*f->outputs)->shape).data;
        iVar2 = calc_shape_size(shape);
        piVar3[0x18] = iVar2;
        if (*piVar3 == local_30) {
          if ((((*(byte *)(*(long *)(piVar3 + 10) + 0x10) & 0xf) == 0) &&
              ((*(byte *)(*(long *)(piVar3 + 0xe) + 0x10) & 0xf) == 0)) &&
             ((*(byte *)(*(long *)(piVar3 + 0x12) + 0x10) & 0xf) == 0)) {
            f->exec_func = exec_batch_matmul;
          }
          else {
            f->exec_func = exec_batch_matmul_generic;
          }
          f_local._4_4_ = RT_FUNCTION_ERROR_NOERROR;
        }
        else {
          f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_SHAPE;
        }
      }
    }
    else {
      f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
    }
  }
  else {
    f_local._4_4_ = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  return f_local._4_4_;
}

Assistant:

rt_function_error_t allocate_batch_matmul_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 2) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  batch_matmul_local_context_t *context =
      (batch_matmul_local_context_t *)(f->local_context);
  batch_matmul_private_t *p = rt_malloc_func(sizeof(batch_matmul_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  ((batch_matmul_local_context_t *)(f->local_context))->data = (void *)p;
  p->row_a = f->inputs[0]->shape.data[f->inputs[0]->shape.size - 2];
  p->col_a = f->inputs[0]->shape.data[f->inputs[0]->shape.size - 1];
  p->row_b = f->inputs[1]->shape.data[f->inputs[1]->shape.size - 2];
  p->col_b = f->inputs[1]->shape.data[f->inputs[1]->shape.size - 1];
  p->row_y = context->transpose_a ? p->col_a : p->row_a;
  p->col_y = context->transpose_b ? p->row_b : p->col_b;
  p->offset_a = p->row_a * p->col_a;
  p->offset_b = p->row_b * p->col_b;
  p->offset_y = p->row_y * p->col_y;

  p->input_a = f->inputs[0];
  p->get_input_a = select_getter(p->input_a);
  p->input_b = f->inputs[1];
  p->get_input_b = select_getter(p->input_b);

  p->samples = 1;
  for (int i = 0; i < f->inputs[0]->shape.size - 2; ++i) {
    p->samples *= f->inputs[0]->shape.data[i];
  }

  int samples_b = 1;
  for (int j = 0; j < f->inputs[1]->shape.size - 2; ++j) {
    samples_b *= f->inputs[1]->shape.data[j];
  }

  p->output = f->outputs[0];
  p->get_output = select_getter(p->output);
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(f->outputs[0]->shape);

  if (p->samples != samples_b) {
    return RT_FUNCTION_ERROR_INVALID_SHAPE;
  }
  if (p->input_a->type == NN_DATA_TYPE_FLOAT &&
      p->input_b->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_BATCHMATMUL_FLOAT32
    f->exec_func = exec_batch_matmul;
#endif /* CONFIG_BATCHMATMUL_FLOAT32 */
  } else {
#ifdef CONFIG_BATCHMATMUL_GENERIC
    f->exec_func = exec_batch_matmul_generic;
#endif /* CONFIG_BATCHMATMUL_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}